

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O3

void __thiscall GraphEdit::paintEvent(GraphEdit *this,QPaintEvent *evt)

{
  Spec SVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QPaintDevice *pQVar10;
  QPainter painter;
  QFontMetrics metrics;
  QRect QStack_98;
  undefined1 local_88 [8];
  undefined8 local_80;
  int local_6c;
  ulong local_68;
  QFontMetrics local_60 [12];
  int local_54;
  QColor *local_50;
  undefined8 local_48;
  undefined4 local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_68 = QAbstractScrollArea::viewport();
  pQVar10 = (QPaintDevice *)(local_68 + 0x10);
  if (local_68 == 0) {
    pQVar10 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter((QPainter *)&QStack_98,pQVar10);
  lVar2 = *(long *)(local_68 + 0x20);
  local_80._0_4_ = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  local_80._4_4_ = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  local_88 = (undefined1  [8])0x0;
  QPainter::fillRect(&QStack_98,(QColor *)local_88);
  local_48 = QAbstractScrollArea::horizontalScrollBar();
  QAbstractScrollArea::verticalScrollBar();
  iVar4 = QAbstractSlider::minimum();
  iVar5 = QAbstractSlider::maximum();
  if (iVar4 == iVar5) {
    QStack_98.y2 = this->mMinValue;
    local_6c = this->mMaxValue;
  }
  else {
    iVar4 = QAbstractSlider::maximum();
    iVar5 = QAbstractSlider::value();
    iVar6 = QAbstractSlider::minimum();
    local_6c = QAbstractSlider::pageStep();
    QStack_98.y2 = (iVar6 - iVar5) + iVar4;
    local_6c = local_6c + QStack_98.y2;
  }
  QFontMetrics::QFontMetrics(local_60,(QFont *)(*(long *)&this->field_0x20 + 0x38));
  local_50 = &this->mSampleColor;
  QPainter::setPen((QColor *)&QStack_98);
  iVar4 = this->mYAxisWidth;
  iVar5 = (this->mPlotRect).y1;
  iVar6 = QFontMetrics::height();
  QString::number((int)local_88,local_6c);
  local_40 = 8;
  local_38 = iVar4 + 7;
  local_34 = iVar5 + iVar6 + -1;
  local_3c = iVar5;
  QPainter::drawText(&QStack_98,(int)&local_40,(QString *)0x22,(QRect *)local_88);
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,8);
    }
  }
  iVar4 = *(int *)(*(long *)(local_68 + 0x20) + 0x18);
  iVar5 = *(int *)(*(long *)(local_68 + 0x20) + 0x20);
  iVar7 = QFontMetrics::height();
  iVar6 = this->mYAxisWidth;
  iVar8 = QFontMetrics::height();
  QString::number((int)local_88,QStack_98.y2);
  local_3c = (iVar5 - (iVar4 + iVar7)) + -7;
  local_40 = 8;
  local_38 = iVar6 + 7;
  local_34 = local_3c + iVar8 + -1;
  QPainter::drawText(&QStack_98,(int)&local_40,(QString *)0x42,(QRect *)local_88);
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,8);
    }
  }
  QPainter::setPen((QColor *)&QStack_98);
  SVar1 = (this->mPlotRect).x1;
  iVar5 = (this->mPlotRect).y1 + -1;
  iVar4 = (this->mPlotRect).y2;
  iVar6 = *(int *)(*(long *)(local_68 + 0x20) + 0x1c) - *(int *)(*(long *)(local_68 + 0x20) + 0x14);
  local_88._4_4_ = iVar5;
  local_88._0_4_ = SVar1 - Rgb;
  local_80._4_4_ = iVar4;
  local_80._0_4_ = SVar1 - Rgb;
  QPainter::drawLines((QLine *)&QStack_98,(int)local_88);
  iVar7 = iVar6 + 1;
  local_88._0_4_ = SVar1;
  local_80._4_4_ = iVar5;
  local_80._0_4_ = iVar7;
  QPainter::drawLines((QLine *)&QStack_98,(int)local_88);
  local_88._4_4_ = iVar4;
  local_80._4_4_ = iVar4;
  QPainter::drawLines((QLine *)&QStack_98,(int)local_88);
  if (this->mBarMode == true) {
    iVar4 = this->mMinValue;
    iVar5 = this->mMaxValue - iVar4;
    QStack_98.y2 = -iVar5;
    if (0 < iVar5) {
      QStack_98.y2 = iVar5;
    }
    iVar5 = (this->mPlotRect).y2;
    local_6c = (iVar5 - (this->mPlotRect).y1) + 1;
    cVar3 = '\0';
    if (0 < iVar4) {
      cVar3 = (char)iVar4;
    }
    local_54 = ((cVar3 - iVar4) * local_6c) / QStack_98.y2;
    iVar6 = iVar4;
    if ((this->mLines == true) && (iVar8 = iVar4 + 1, iVar8 < this->mMaxValue)) {
      iVar6 = iVar4 << 0x18;
      do {
        iVar6 = iVar6 + 0x1000000;
        local_88._4_4_ = iVar5 - (((iVar6 >> 0x18) - iVar4) * local_6c) / QStack_98.y2;
        local_88._0_4_ = (this->mPlotRect).x1;
        local_80._4_4_ = local_88._4_4_;
        QPainter::drawLines((QLine *)&QStack_98,(int)local_88);
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->mMaxValue);
      iVar6 = this->mMinValue;
    }
    local_88._4_4_ = iVar5 - local_54;
    local_68 = (ulong)(uint)local_88._4_4_;
    if (iVar6 != 0) {
      local_88._0_4_ = (this->mPlotRect).x1;
      local_80._4_4_ = local_88._4_4_;
      QPainter::drawLines((QLine *)&QStack_98,(int)local_88);
    }
    local_88 = (undefined1  [8])(double)(this->mPlotRect).x1;
    local_80 = 0.0;
    QPainter::translate((QPointF *)&QStack_98);
    QPainter::setPen((QColor *)&QStack_98);
    if ((this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
        super__Optional_payload_base<QPoint>._M_engaged == true) {
      local_88._0_4_ =
           (this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
           super__Optional_payload_base<QPoint>._M_payload._M_value.xp * this->mCellWidth;
      local_88._4_4_ = (int)local_68;
      local_80 = (double)CONCAT44(iVar5 + ~(((*(char *)((long)&(this->mMouseOver).
                                                                                                                              
                                                  super__Optional_base<QPoint,_true,_true>.
                                                  _M_payload.super__Optional_payload_base<QPoint>.
                                                  _M_payload + 4) - iVar4) * local_6c) /
                                           QStack_98.y2),this->mCellWidth + local_88._0_4_ + -1);
      QPainter::drawRects(&QStack_98,(int)local_88);
    }
    iVar6 = (**(code **)(*(long *)this->mModel + 0x60))();
    iVar5 = QAbstractSlider::value();
    if (iVar5 < iVar6) {
      iVar7 = (int)local_68;
      iVar8 = 1;
      do {
        cVar3 = (**(code **)(*(long *)this->mModel + 0x68))(this->mModel,iVar5);
        iVar9 = local_54 - ((cVar3 - iVar4) * local_6c) / QStack_98.y2;
        if (iVar9 == 0) {
          iVar9 = 1;
        }
        local_88._4_4_ = (int)local_68;
        local_88._0_4_ = iVar8;
        local_80 = (double)CONCAT44(iVar9 + iVar7 + -1,this->mCellWidth + iVar8 + -2);
        QPainter::fillRect(&QStack_98,(QColor *)local_88);
        iVar5 = iVar5 + 1;
        iVar8 = iVar8 + this->mCellWidth;
      } while (iVar6 != iVar5);
    }
  }
  else {
    iVar4 = (this->mPlotRect).y1;
    iVar5 = (this->mPlotRect).y2;
    iVar8 = this->mCellHeight;
    iVar9 = iVar5 - iVar8;
    if (iVar4 < iVar9) {
      do {
        local_88._4_4_ = iVar9;
        local_88._0_4_ = (this->mPlotRect).x1;
        local_80._4_4_ = iVar9;
        QPainter::drawLines((QLine *)&QStack_98,(int)local_88);
        iVar8 = this->mCellHeight;
        iVar9 = iVar9 - iVar8;
      } while (iVar4 < iVar9);
      iVar5 = (this->mPlotRect).y2;
    }
    iVar4 = this->mAlternateInterval;
    if (iVar4 != 0) {
      iVar7 = QStack_98.y2 % iVar4;
      if (iVar7 < 0) {
        iVar7 = -iVar7;
      }
      else {
        iVar7 = (iVar4 - iVar7) % iVar4;
      }
      iVar9 = iVar5 - iVar7 * iVar8;
      iVar7 = (this->mPlotRect).y1;
      if (iVar7 < iVar9) {
        do {
          local_88._0_4_ = (this->mPlotRect).x1;
          local_88._4_4_ = (iVar9 - this->mCellHeight) + 1;
          local_80._4_4_ = iVar9 + -1;
          local_80._0_4_ = local_88._0_4_ + iVar6;
          QPainter::fillRect(&QStack_98,(QColor *)local_88);
          iVar9 = iVar9 - iVar8 * iVar4;
        } while (iVar7 < iVar9);
        iVar5 = (this->mPlotRect).y2;
        iVar8 = this->mCellHeight;
      }
    }
    local_88 = (undefined1  [8])(double)(this->mPlotRect).x1;
    local_80 = (double)(iVar8 * QStack_98.y2 + iVar5);
    QPainter::translate((QPointF *)&QStack_98);
    QPainter::scale(1.0,-1.0);
    QPainter::setPen((QColor *)&QStack_98);
    if ((this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
        super__Optional_payload_base<QPoint>._M_engaged == true) {
      local_88._0_4_ =
           this->mCellWidth *
           (this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
           super__Optional_payload_base<QPoint>._M_payload._M_value.xp;
      local_88._4_4_ =
           ((this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
            super__Optional_payload_base<QPoint>._M_payload._M_value.yp + QStack_98.y2) *
           this->mCellHeight;
      local_80 = (double)CONCAT44(this->mCellHeight + -1 + local_88._4_4_,
                                  this->mCellWidth + local_88._0_4_ + -1);
      QPainter::drawRects(&QStack_98,(int)local_88);
    }
    iVar5 = (**(code **)(*(long *)this->mModel + 0x60))();
    iVar4 = QAbstractSlider::value();
    if (iVar4 < iVar5) {
      iVar6 = 1;
      do {
        cVar3 = (**(code **)(*(long *)this->mModel + 0x68))(this->mModel,iVar4);
        iVar7 = (int)cVar3;
        if ((QStack_98.y2 <= iVar7) && (iVar7 <= local_6c)) {
          local_88._4_4_ = iVar7 * this->mCellHeight;
          local_88._0_4_ = iVar6;
          local_80 = (double)CONCAT44(this->mCellHeight + -2 + local_88._4_4_,
                                      this->mCellWidth + iVar6 + -2);
          QPainter::fillRect(&QStack_98,(QColor *)local_88);
        }
        iVar4 = iVar4 + 1;
        iVar6 = iVar6 + this->mCellWidth;
      } while (iVar5 != iVar4);
    }
  }
  QFontMetrics::~QFontMetrics(local_60);
  QPainter::~QPainter((QPainter *)&QStack_98);
  return;
}

Assistant:

void GraphEdit::paintEvent(QPaintEvent *evt) {
    Q_UNUSED(evt)

    // paint on the viewport widget
    auto _viewport = viewport();
    QPainter painter(_viewport);

    // doing this manually instead of using auto-fill background because changing the
    // background role color in QPalette has no effect (tried both this widgets and the viewport widgets palette)
    painter.fillRect(_viewport->rect(), mBackgroundColor);

    auto hscroll = horizontalScrollBar();
    auto vscroll = verticalScrollBar();
    
    int viewportMin;
    int viewportMax;
    if (vscroll->minimum() == vscroll->maximum()) {
        viewportMin = mMinValue;
        viewportMax = mMaxValue;
    } else {
        auto value = vscroll->maximum() - (vscroll->value() - vscroll->minimum());
        viewportMin = value;
        viewportMax = value + vscroll->pageStep();
    }

    auto metrics = fontMetrics();

    // viewport minimum/maximum or just minimum/maximum
    painter.setPen(mSampleColor);
    painter.drawText(TU::PADDING_X, mPlotRect.top(), mYAxisWidth, metrics.height(), Qt::AlignRight | Qt::AlignTop, QString::number(viewportMax));
    painter.drawText(TU::PADDING_X, _viewport->height() - TU::PADDING_Y - metrics.height(), mYAxisWidth, metrics.height(), Qt::AlignRight | Qt::AlignBottom, QString::number(viewportMin));


    // Grid lines
    painter.setPen(mLineColor);
    auto const plotTop = mPlotRect.top() - 1;
    auto const plotBottom = mPlotRect.bottom();
    auto const axis = mPlotRect.left() - 1;
    auto const viewportWidth = _viewport->width();
    painter.drawLine(axis, plotTop, axis, plotBottom);
    painter.drawLine(axis + 1, plotTop, viewportWidth, plotTop);
    painter.drawLine(axis + 1, plotBottom, viewportWidth, plotBottom);

    if (mBarMode) {
        TU::BarPlotter plotter(mPlotRect, mMinValue, mMaxValue);
        if (mLines) {
            for (int i = mMinValue + 1; i < mMaxValue; ++i) {
                auto ypos = plotter.plot((GraphModel::DataType)i);
                painter.drawLine(mPlotRect.left(), ypos, viewportWidth, ypos);
            }
        }

        // xaxis (only drawn if the minimum value isn't 0, since then it is the bottom line of the plot)
        if (mMinValue) {
            painter.drawLine(mPlotRect.left(), plotter.xaxis(), viewportWidth, plotter.xaxis());
        }

        // mouse hover
        painter.translate(QPoint(mPlotRect.x(), 0));
        painter.setPen(mSampleColor);
        if (mMouseOver) {
            painter.drawRect(
                mMouseOver->x() * mCellWidth,
                plotter.xaxis(), 
                mCellWidth, 
                plotter.plot((GraphModel::DataType)mMouseOver->y()) - plotter.xaxis()
            );
        }

        // bars
        auto count = mModel.count();
        int xpos = 1;
        for (auto i = hscroll->value(); i < count; ++i, xpos += mCellWidth) {
            auto h = plotter.plot(mModel.dataAt(i)) - plotter.xaxis();
            if (h == 0) {
                h = 1;
            }
            painter.fillRect(xpos, plotter.xaxis(), mCellWidth - 1, h, mSampleColor);
        }

    } else {
        // always draw lines for sample view
        {
            int ypos = mPlotRect.bottom() - mCellHeight;
            for (int const top = mPlotRect.top(); ypos > top; ypos -= mCellHeight) {
                painter.drawLine(mPlotRect.left(), ypos, viewportWidth, ypos);
            }
        }

        if (mAlternateInterval) {
            int ypos = mPlotRect.bottom() - TU::mod(viewportMin, mAlternateInterval) * mCellHeight;
            int skip = mAlternateInterval * mCellHeight;
            for (int const top = mPlotRect.top(); ypos > top; ypos -= skip) {
                painter.fillRect(mPlotRect.left(), ypos - mCellHeight + 1, viewportWidth, mCellHeight - 1, mAlternateColor);
            }

        }

        painter.translate(QPoint(mPlotRect.x(), mPlotRect.bottom() + viewportMin * mCellHeight));
        painter.scale(1.0, -1.0);
        painter.setPen(mSampleColor);
        
        if (mMouseOver) {
            painter.drawRect(
                mMouseOver->x() * mCellWidth,
                (mMouseOver->y() + viewportMin) * mCellHeight, 
                mCellWidth, 
                mCellHeight
            );
        }

        auto count = mModel.count();
        int xpos = 1;
        for (int i = hscroll->value(); i < count; ++i, xpos += mCellWidth) {
            auto sample = mModel.dataAt(i);
            if (sample < viewportMin || sample > viewportMax) {
                continue;
            }
            auto ypos = sample * mCellHeight;
            painter.fillRect(xpos, ypos, mCellWidth - 1, mCellHeight - 1, mSampleColor);
        }
    }

}